

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t assertion_non_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  char *fmt;
  stat st;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = stat(f1,(stat *)&st);
  if (iVar1 == 0) {
    if (st.st_size != 0) {
      return L'\x01';
    }
    fmt = "File empty: %s";
  }
  else {
    fmt = "Stat failed: %s";
  }
  failure_start(filename,line,fmt,f1);
  failure_finish(filename);
  return L'\0';
}

Assistant:

int
assertion_non_empty_file(const char *filename, int line, const char *f1)
{
	struct stat st;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0) {
		failure_start(filename, line, "File empty: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}